

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

StringRef __thiscall llbuild::buildsystem::BuildKey::getDirectoryPath(BuildKey *this)

{
  bool bVar1;
  StringRef SVar2;
  
  bVar1 = isDirectoryContents(this);
  if (bVar1) {
    SVar2.Data = (this->key).key._M_dataplus._M_p + 1;
    SVar2.Length = (this->key).key._M_string_length - 1;
    return SVar2;
  }
  __assert_fail("isDirectoryContents()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0xf5,"StringRef llbuild::buildsystem::BuildKey::getDirectoryPath() const");
}

Assistant:

StringRef getDirectoryPath() const {
    assert(isDirectoryContents());
    return StringRef(key.data()+1, key.size()-1);
  }